

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O2

void Fra_FramesAddMore(Aig_Man_t *p,int nFrames)

{
  int iVar1;
  void *pvVar2;
  undefined8 *__ptr;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *p1;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  
  iVar6 = 0;
  while( true ) {
    iVar1 = p->vObjs->nSize;
    if (iVar1 <= iVar6) break;
    pvVar2 = Vec_PtrEntry(p->vObjs,iVar6);
    if (pvVar2 != (void *)0x0) {
      *(void **)((long)pvVar2 + 0x28) = pvVar2;
    }
    iVar6 = iVar6 + 1;
  }
  __ptr = (undefined8 *)malloc((long)p->nRegs << 3);
  iVar6 = 0;
  if (nFrames < 1) {
    nFrames = 0;
  }
  do {
    if (iVar6 == nFrames) {
      free(__ptr);
      return;
    }
    for (iVar7 = p->nObjs[3] - p->nRegs; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCos,iVar7);
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    }
    for (iVar7 = p->nObjs[2] - p->nRegs; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCis,iVar7);
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    }
    puVar8 = __ptr;
    for (iVar7 = p->nObjs[3] - p->nRegs; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
      if (*(long *)(((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) + 0x28) == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = Aig_ObjChild0Copy(pAVar3);
      }
      *puVar8 = pAVar3;
      puVar8 = puVar8 + 1;
    }
    puVar8 = __ptr;
    for (iVar7 = p->nObjs[2] - p->nRegs; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCis,iVar7);
      *(undefined8 *)((long)pvVar2 + 0x28) = *puVar8;
      puVar8 = puVar8 + 1;
    }
    for (iVar7 = 0; iVar7 < p->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar7);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        if (iVar1 < iVar7) break;
        if ((*(long *)(((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) + 0x28) == 0) ||
           (*(long *)(((ulong)pAVar3->pFanin1 & 0xfffffffffffffffe) + 0x28) == 0)) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = Aig_ObjChild0Copy(pAVar3);
          if (((ulong)pAVar3 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
          }
          uVar5 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
          if (uVar5 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)((ulong)((uint)pAVar3->pFanin1 & 1) ^ *(ulong *)(uVar5 + 0x28));
          }
          pAVar4 = Aig_And(p,pAVar4,p1);
        }
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void Fra_FramesAddMore( Aig_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, ** pLatches;
    int i, k, f, nNodesOld;
    // set copy pointer of each object to point to itself
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = pObj;
    // iterate and add objects
    nNodesOld = Aig_ManObjNumMax(p);
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p) );
    for ( f = 0; f < nFrames; f++ )
    {
        // clean latch inputs and outputs
        Aig_ManForEachLiSeq( p, pObj, i )
            pObj->pData = NULL;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = NULL;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p, pObj, i )
        {
            if ( Aig_ObjFanin0(pObj)->pData )
                pLatches[k++] = Aig_ObjChild0Copy(pObj);
            else
                pLatches[k++] = NULL;
        }
        // insert them as the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = pLatches[k++];
        // create the next time frame of nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( i > nNodesOld )
                break;
            if ( Aig_ObjFanin0(pObj)->pData && Aig_ObjFanin1(pObj)->pData )
                pObj->pData = Aig_And( p, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else
                pObj->pData = NULL;
        }
    }
    ABC_FREE( pLatches );
}